

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiceDriver.cpp
# Opt level: O2

bool test_DiceRoller_getPercentages(void)

{
  int *piVar1;
  int iVar2;
  _Vector_base<int,_std::allocator<int>_> *this;
  DiceRoller *this_00;
  reference pvVar3;
  int x;
  int iVar4;
  size_type __n;
  bool bVar5;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  this = (_Vector_base<int,_std::allocator<int>_> *)operator_new(0x18);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)this,6,(allocator_type *)&local_48);
  this_00 = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(this_00);
  iVar4 = 100;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    DiceRoller::roll((vector<int,_std::allocator<int>_> *)&local_48,this_00,1);
    pvVar3 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)&local_48,0);
    iVar2 = *pvVar3;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_48);
    piVar1 = (this->_M_impl).super__Vector_impl_data._M_start + (long)iVar2 + -1;
    *piVar1 = *piVar1 + 1;
  }
  bVar5 = true;
  for (__n = 0; (long)__n <
                (long)(int)((ulong)((long)(this->_M_impl).super__Vector_impl_data._M_finish -
                                   (long)(this->_M_impl).super__Vector_impl_data._M_start) >> 2);
      __n = __n + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)this,__n);
    if (bVar5) {
      iVar4 = *pvVar3;
      DiceRoller::getPercentages((vector<double,_std::allocator<double>_> *)&local_48,this_00);
      bVar5 = (double)iVar4 / 100.0 == local_48._M_impl.super__Vector_impl_data._M_start[__n];
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    }
    else {
      bVar5 = false;
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(this);
  operator_delete(this,0x18);
  DiceRoller::~DiceRoller(this_00);
  operator_delete(this_00,0x10);
  return bVar5;
}

Assistant:

bool test_DiceRoller_getPercentages() {
    bool success = true;
    int timesRolled = 0;
    auto* history = new std::vector<int>(6);
    auto* roller = new DiceRoller();
    for (int x = 0; x < 100; x++) {
        int roll = roller->roll(1).at(0);
        timesRolled++;
        (*history)[roll - 1]++;
    }

    for (int x = 0; x < (int) history->size(); x++) {
        double percent = (double) history->at(x) / (double) timesRolled;
        success = success && percent == roller->getPercentages()[x];
    }

    delete (history);
    delete (roller);

    return success;
}